

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm_encode_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  basic_string_view<char,_std::char_traits<char>_> __args;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint *puVar6;
  char *pcVar7;
  ostream *poVar8;
  int *piVar9;
  pointer pWVar10;
  double *pdVar11;
  bool *pbVar12;
  pointer pRVar13;
  flat_hash_map<std::__cxx11::basic_string<char>,_int> *m;
  undefined1 auVar14 [16];
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [16];
  reference local_568;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *it;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  string local_518 [38];
  byte local_4f2;
  Die local_4f1;
  Status local_4f0 [8];
  Status _status_4;
  unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
  local_4d8;
  unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
  input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  anon_class_24_3_9840e6c0 local_4a8;
  anon_class_32_4_a85a1878 local_490;
  anon_class_32_4_a85ed13a local_470;
  anon_class_32_4_3cd1434b local_450;
  anon_class_40_5_eb105556 local_430;
  anon_class_40_5_eb150e18 local_408;
  anon_class_16_2_74abb145 local_3e0;
  anon_class_24_3_1a3f379b local_3d0;
  anon_class_24_3_1a43f05d local_3b8;
  anon_class_24_3_31785da6 local_3a0;
  float local_388;
  int local_384;
  float alpha;
  int nbest_size;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> process;
  NBestSentencePieceText nbest_spt;
  SentencePieceText local_330 [8];
  SentencePieceText spt;
  undefined1 local_2d8 [8];
  flat_hash_map<std::string,_int> vocab;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  nbest_ids;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  nbest_sps;
  vector<int,_std::allocator<int>_> ids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sps;
  string line;
  string local_218 [38];
  byte local_1f2;
  Die local_1f1;
  Status local_1f0 [8];
  Status _status_3;
  unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
  local_1d8;
  unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
  output;
  string local_1c8 [38];
  byte local_1a2;
  Die local_1a1;
  undefined1 local_1a0 [16];
  Status local_190 [8];
  Status _status_2;
  string local_180 [38];
  byte local_15a;
  Die local_159;
  undefined1 local_158 [16];
  Status local_148 [8];
  Status _status_1;
  string local_138 [38];
  byte local_112;
  Die local_111;
  undefined1 local_110 [16];
  Status local_100 [8];
  Status _status;
  SentencePieceProcessor sp;
  Die local_9a;
  allocator<char> local_99;
  value_type local_98;
  allocator<char> local_71;
  value_type local_70;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest_args;
  ScopedResourceDestructor local_19;
  char **ppcStack_18;
  ScopedResourceDestructor cleaner;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  sentencepiece::ScopedResourceDestructor::ScopedResourceDestructor(&local_19);
  sentencepiece::ParseCommandLineFlags
            (*ppcStack_18,(int *)&argv_local,&stack0xffffffffffffffe8,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  absl::GetFlag<std::__cxx11::string>
            ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)FLAGS_input_abi_cxx11_);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pbVar5 = absl::GetFlag<std::__cxx11::string>
                       ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)FLAGS_input_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48,pbVar5);
  }
  else {
    for (local_4c = 1; local_4c < (int)argv_local; local_4c = local_4c + 1) {
      pcVar7 = ppcStack_18[local_4c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar7,&local_71);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  puVar6 = absl::GetFlag<unsigned_int>((Flag<unsigned_int> *)FLAGS_random_seed);
  if (*puVar6 != 0xffffffff) {
    puVar6 = absl::GetFlag<unsigned_int>((Flag<unsigned_int> *)FLAGS_random_seed);
    sentencepiece::SetRandomGeneratorSeed(*puVar6);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  absl::GetFlag<std::__cxx11::string>
            ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)FLAGS_model_abi_cxx11_);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    sentencepiece::error::Die::Die(&local_9a,true);
    pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x4a);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"!absl::GetFlag(FLAGS_model).empty()");
    poVar8 = std::operator<<(poVar8,"] ");
    sentencepiece::error::Die::operator&(&local_9a,poVar8);
    sentencepiece::error::Die::~Die(&local_9a);
  }
  sentencepiece::SentencePieceProcessor::SentencePieceProcessor((SentencePieceProcessor *)&_status);
  pbVar5 = absl::GetFlag<std::__cxx11::string>
                     ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)FLAGS_model_abi_cxx11_);
  local_110 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
  sentencepiece::SentencePieceProcessor::Load(local_100,&_status,local_110._0_8_,local_110._8_8_);
  local_112 = 0;
  bVar1 = sentencepiece::util::Status::ok(local_100);
  if (!bVar1) {
    sentencepiece::error::Die::Die(&local_111,true);
    local_112 = 1;
    pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x4d);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"_status.ok()");
    poVar8 = std::operator<<(poVar8,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,local_138);
    sentencepiece::error::Die::operator&(&local_111,poVar8);
    std::__cxx11::string::~string(local_138);
  }
  if ((local_112 & 1) != 0) {
    sentencepiece::error::Die::~Die(&local_111);
  }
  sentencepiece::util::Status::~Status(local_100);
  pbVar5 = absl::GetFlag<std::__cxx11::string>
                     ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)FLAGS_extra_options_abi_cxx11_);
  local_158 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
  sentencepiece::SentencePieceProcessor::SetEncodeExtraOptions
            (local_148,&_status,local_158._0_8_,local_158._8_8_);
  local_15a = 0;
  bVar1 = sentencepiece::util::Status::ok(local_148);
  if (!bVar1) {
    sentencepiece::error::Die::Die(&local_159,true);
    local_15a = 1;
    pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x4e);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"_status.ok()");
    poVar8 = std::operator<<(poVar8,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,local_180);
    sentencepiece::error::Die::operator&(&local_159,poVar8);
    std::__cxx11::string::~string(local_180);
  }
  if ((local_15a & 1) != 0) {
    sentencepiece::error::Die::~Die(&local_159);
  }
  sentencepiece::util::Status::~Status(local_148);
  absl::GetFlag<std::__cxx11::string>
            ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)FLAGS_vocabulary_abi_cxx11_);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pbVar5 = absl::GetFlag<std::__cxx11::string>
                       ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)FLAGS_vocabulary_abi_cxx11_);
    local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
    piVar9 = absl::GetFlag<int>((Flag<int> *)FLAGS_vocabulary_threshold);
    sentencepiece::SentencePieceProcessor::LoadVocabulary
              (local_190,&_status,local_1a0._0_8_,local_1a0._8_8_,*piVar9);
    local_1a2 = 0;
    output._M_t.
    super___uniq_ptr_impl<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::filesystem::WritableFile_*,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
    .super__Head_base<0UL,_sentencepiece::filesystem::WritableFile_*,_false>._M_head_impl._7_1_ = 0;
    bVar1 = sentencepiece::util::Status::ok(local_190);
    if (!bVar1) {
      sentencepiece::error::Die::Die(&local_1a1,true);
      local_1a2 = 1;
      pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
      poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x52);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"_status.ok()");
      poVar8 = std::operator<<(poVar8,"] ");
      sentencepiece::util::Status::ToString_abi_cxx11_();
      output._M_t.
      super___uniq_ptr_impl<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_sentencepiece::filesystem::WritableFile_*,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
      .super__Head_base<0UL,_sentencepiece::filesystem::WritableFile_*,_false>._M_head_impl._7_1_ =
           1;
      poVar8 = std::operator<<(poVar8,local_1c8);
      sentencepiece::error::Die::operator&(&local_1a1,poVar8);
    }
    if ((output._M_t.
         super___uniq_ptr_impl<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
         ._M_t.
         super__Tuple_impl<0UL,_sentencepiece::filesystem::WritableFile_*,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
         .super__Head_base<0UL,_sentencepiece::filesystem::WritableFile_*,_false>._M_head_impl._7_1_
        & 1) != 0) {
      std::__cxx11::string::~string(local_1c8);
    }
    if ((local_1a2 & 1) != 0) {
      sentencepiece::error::Die::~Die(&local_1a1);
    }
    sentencepiece::util::Status::~Status(local_190);
  }
  pbVar5 = absl::GetFlag<std::__cxx11::string>
                     ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)FLAGS_output_abi_cxx11_);
  auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
  __status_3 = auVar14._0_8_;
  sentencepiece::filesystem::NewWritableFile(&local_1d8,__status_3,auVar14._8_8_,0);
  pWVar10 = std::
            unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
            ::operator->(&local_1d8);
  (**(code **)(*(long *)pWVar10 + 0x10))(local_1f0);
  local_1f2 = 0;
  bVar1 = sentencepiece::util::Status::ok(local_1f0);
  if (!bVar1) {
    sentencepiece::error::Die::Die(&local_1f1,true);
    local_1f2 = 1;
    pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x57);
    poVar8 = std::operator<<(poVar8,") [");
    poVar8 = std::operator<<(poVar8,"_status.ok()");
    poVar8 = std::operator<<(poVar8,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,local_218);
    sentencepiece::error::Die::operator&(&local_1f1,poVar8);
    std::__cxx11::string::~string(local_218);
  }
  if ((local_1f2 & 1) != 0) {
    sentencepiece::error::Die::~Die(&local_1f1);
  }
  sentencepiece::util::Status::~Status(local_1f0);
  std::__cxx11::string::string
            ((string *)
             &sps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &nbest_sps.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&nbest_ids.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&vocab._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_2d8);
  sentencepiece::SentencePieceText::SentencePieceText(local_330);
  sentencepiece::NBestSentencePieceText::NBestSentencePieceText
            ((NBestSentencePieceText *)&process._M_invoker);
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&alpha);
  piVar9 = absl::GetFlag<int>((Flag<int> *)FLAGS_nbest_size);
  local_384 = *piVar9;
  pdVar11 = absl::GetFlag<double>((Flag<double> *)FLAGS_alpha);
  local_388 = (float)*pdVar11;
  pbVar12 = absl::GetFlag<bool>((Flag<bool> *)FLAGS_generate_vocabulary);
  if ((*pbVar12 & 1U) == 0) {
    pbVar5 = absl::GetFlag<std::__cxx11::string>
                       ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)FLAGS_output_format_abi_cxx11_);
    bVar1 = std::operator==(pbVar5,"piece");
    if (bVar1) {
      local_3b8.sp = (SentencePieceProcessor *)&_status;
      local_3b8.sps =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_3b8.output = &local_1d8;
      std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)&alpha,
                 &local_3b8);
    }
    else {
      pbVar5 = absl::GetFlag<std::__cxx11::string>
                         ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)FLAGS_output_format_abi_cxx11_);
      bVar1 = std::operator==(pbVar5,"id");
      if (bVar1) {
        local_3d0.sp = (SentencePieceProcessor *)&_status;
        local_3d0.ids =
             (vector<int,_std::allocator<int>_> *)
             &nbest_sps.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d0.output = &local_1d8;
        std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                  ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)&alpha,
                   &local_3d0);
      }
      else {
        pbVar5 = absl::GetFlag<std::__cxx11::string>
                           ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)FLAGS_output_format_abi_cxx11_);
        bVar1 = std::operator==(pbVar5,"proto");
        if (bVar1) {
          local_3e0.sp = (SentencePieceProcessor *)&_status;
          local_3e0.spt = local_330;
          std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                    ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)&alpha,
                     &local_3e0);
        }
        else {
          pbVar5 = absl::GetFlag<std::__cxx11::string>
                             ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)FLAGS_output_format_abi_cxx11_);
          bVar1 = std::operator==(pbVar5,"sample_piece");
          if (bVar1) {
            local_408.sp = (SentencePieceProcessor *)&_status;
            local_408.nbest_size = &local_384;
            local_408.alpha = &local_388;
            local_408.sps =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            local_408.output = &local_1d8;
            std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                      ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)&alpha
                       ,&local_408);
          }
          else {
            pbVar5 = absl::GetFlag<std::__cxx11::string>
                               ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)FLAGS_output_format_abi_cxx11_);
            bVar1 = std::operator==(pbVar5,"sample_id");
            if (bVar1) {
              local_430.sp = (SentencePieceProcessor *)&_status;
              local_430.nbest_size = &local_384;
              local_430.alpha = &local_388;
              local_430.ids =
                   (vector<int,_std::allocator<int>_> *)
                   &nbest_sps.
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_430.output = &local_1d8;
              std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                        ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                         &alpha,&local_430);
            }
            else {
              pbVar5 = absl::GetFlag<std::__cxx11::string>
                                 ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)FLAGS_output_format_abi_cxx11_);
              bVar1 = std::operator==(pbVar5,"sample_proto");
              if (bVar1) {
                local_450.sp = (SentencePieceProcessor *)&_status;
                local_450.nbest_size = &local_384;
                local_450.alpha = &local_388;
                local_450.spt = local_330;
                std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
                          ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                           &alpha,&local_450);
              }
              else {
                pbVar5 = absl::GetFlag<std::__cxx11::string>
                                   ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)FLAGS_output_format_abi_cxx11_);
                bVar1 = std::operator==(pbVar5,"nbest_piece");
                if (bVar1) {
                  local_470.sp = (SentencePieceProcessor *)&_status;
                  local_470.nbest_size = &local_384;
                  local_470.nbest_sps =
                       (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&nbest_ids.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_470.output = &local_1d8;
                  std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                  operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)
                            &alpha,&local_470);
                }
                else {
                  pbVar5 = absl::GetFlag<std::__cxx11::string>
                                     ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)FLAGS_output_format_abi_cxx11_);
                  bVar1 = std::operator==(pbVar5,"nbest_id");
                  if (bVar1) {
                    local_490.sp = (SentencePieceProcessor *)&_status;
                    local_490.nbest_size = &local_384;
                    local_490.nbest_ids =
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&vocab._M_h._M_single_bucket;
                    local_490.output = &local_1d8;
                    std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                    operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)> *
                              )&alpha,&local_490);
                  }
                  else {
                    pbVar5 = absl::GetFlag<std::__cxx11::string>
                                       ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)FLAGS_output_format_abi_cxx11_);
                    bVar1 = std::operator==(pbVar5,"nbest_proto");
                    if (bVar1) {
                      local_4a8.sp = (SentencePieceProcessor *)&_status;
                      local_4a8.nbest_size = &local_384;
                      local_4a8.nbest_spt = (NBestSentencePieceText *)&process._M_invoker;
                      std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
                      operator=((function<void(std::basic_string_view<char,std::char_traits<char>>)>
                                 *)&alpha,&local_4a8);
                    }
                    else {
                      __range1._6_1_ = 0;
                      iVar3 = sentencepiece::logging::GetMinLogLevel();
                      if (iVar3 < 4) {
                        sentencepiece::error::Die::Die((Die *)((long)&__range1 + 7),true);
                        __range1._6_1_ = 1;
                        pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
                        poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
                        poVar8 = std::operator<<(poVar8,"(");
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x9b);
                        poVar8 = std::operator<<(poVar8,") ");
                        poVar8 = std::operator<<(poVar8,"LOG(");
                        poVar8 = std::operator<<(poVar8,"FATAL");
                        poVar8 = std::operator<<(poVar8,") ");
                        poVar8 = std::operator<<(poVar8,"Unknown output format: ");
                        pbVar5 = absl::GetFlag<std::__cxx11::string>
                                           ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)FLAGS_output_format_abi_cxx11_);
                        poVar8 = std::operator<<(poVar8,(string *)pbVar5);
                        sentencepiece::error::Die::operator&((Die *)((long)&__range1 + 7),poVar8);
                      }
                      if ((__range1._6_1_ & 1) != 0) {
                        sentencepiece::error::Die::~Die((Die *)((long)&__range1 + 7));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_3a0.sp = (SentencePieceProcessor *)&_status;
    local_3a0.spt = local_330;
    local_3a0.vocab = (flat_hash_map<std::string,_int> *)local_2d8;
    std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<void(std::basic_string_view<char,std::char_traits<char>>)> *)&alpha,
               &local_3a0);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
  filename = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&filename);
    if (!bVar1) break;
    input._M_t.
    super___uniq_ptr_impl<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::filesystem::ReadableFile_*,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
    .super__Head_base<0UL,_sentencepiece::filesystem::ReadableFile_*,_false>._M_head_impl =
         (__uniq_ptr_data<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)
                         input._M_t.
                         super___uniq_ptr_impl<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::filesystem::ReadableFile_*,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
                         .super__Head_base<0UL,_sentencepiece::filesystem::ReadableFile_*,_false>.
                         _M_head_impl);
    __status_4 = auVar14._0_8_;
    sentencepiece::filesystem::NewReadableFile(&local_4d8,__status_4,auVar14._8_8_,0);
    pRVar13 = std::
              unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
              ::operator->(&local_4d8);
    (**(code **)(*(long *)pRVar13 + 0x10))(local_4f0);
    local_4f2 = 0;
    bVar1 = sentencepiece::util::Status::ok(local_4f0);
    if (!bVar1) {
      sentencepiece::error::Die::Die(&local_4f1,true);
      local_4f2 = 1;
      pcVar7 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
      poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xa1);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"_status.ok()");
      poVar8 = std::operator<<(poVar8,"] ");
      sentencepiece::util::Status::ToString_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,local_518);
      sentencepiece::error::Die::operator&(&local_4f1,poVar8);
      std::__cxx11::string::~string(local_518);
    }
    if ((local_4f2 & 1) != 0) {
      sentencepiece::error::Die::~Die(&local_4f1);
    }
    sentencepiece::util::Status::~Status(local_4f0);
    while( true ) {
      pRVar13 = std::
                unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
                ::operator->(&local_4d8);
      bVar2 = (**(code **)(*(long *)pRVar13 + 0x18))
                        (pRVar13,&sps.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar2 & 1) == 0) break;
      __args = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)
                          &sps.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&alpha,
                 __args);
    }
    std::
    unique_ptr<sentencepiece::filesystem::ReadableFile,_std::default_delete<sentencepiece::filesystem::ReadableFile>_>
    ::~unique_ptr(&local_4d8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pbVar12 = absl::GetFlag<bool>((Flag<bool> *)FLAGS_generate_vocabulary);
  if ((*pbVar12 & 1U) != 0) {
    sentencepiece::Sorted<std::__cxx11::string,int>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&__begin2,(sentencepiece *)local_2d8,m);
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)&__begin2);
    it = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                                  *)&it);
      if (!bVar1) break;
      local_568 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                  ::operator*(&__end2);
      pWVar10 = std::
                unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
                ::operator->(&local_1d8);
      std::operator+(&local_5b8,&local_568->first,"\t");
      sentencepiece::string_util::SimpleItoa<int>(&local_5d8,local_568->second);
      std::operator+(&local_598,&local_5b8,&local_5d8);
      auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_598);
      local_578 = auVar14;
      (**(code **)(*(long *)pWVar10 + 0x20))(pWVar10,auVar14._0_8_,auVar14._8_8_);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5b8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&__begin2);
  }
  argv_local._4_4_ = 0;
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&alpha);
  sentencepiece::NBestSentencePieceText::~NBestSentencePieceText
            ((NBestSentencePieceText *)&process._M_invoker);
  sentencepiece::SentencePieceText::~SentencePieceText(local_330);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_2d8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&vocab._M_h._M_single_bucket);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&nbest_ids.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &nbest_sps.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &sps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  unique_ptr<sentencepiece::filesystem::WritableFile,_std::default_delete<sentencepiece::filesystem::WritableFile>_>
  ::~unique_ptr(&local_1d8);
  sentencepiece::SentencePieceProcessor::~SentencePieceProcessor((SentencePieceProcessor *)&_status)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  sentencepiece::ScopedResourceDestructor::~ScopedResourceDestructor(&local_19);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  sentencepiece::ScopedResourceDestructor cleaner;
  sentencepiece::ParseCommandLineFlags(argv[0], &argc, &argv, true);
  std::vector<std::string> rest_args;

  if (absl::GetFlag(FLAGS_input).empty()) {
    for (int i = 1; i < argc; ++i) {
      rest_args.push_back(std::string(argv[i]));
    }
  } else {
    rest_args.push_back(absl::GetFlag(FLAGS_input));
  }

  if (absl::GetFlag(FLAGS_random_seed) != -1) {
    sentencepiece::SetRandomGeneratorSeed(absl::GetFlag(FLAGS_random_seed));
  }

  if (rest_args.empty())
    rest_args.push_back("");  // empty means that reading from stdin.

  CHECK(!absl::GetFlag(FLAGS_model).empty());

  sentencepiece::SentencePieceProcessor sp;
  CHECK_OK(sp.Load(absl::GetFlag(FLAGS_model)));
  CHECK_OK(sp.SetEncodeExtraOptions(absl::GetFlag(FLAGS_extra_options)));

  if (!absl::GetFlag(FLAGS_vocabulary).empty()) {
    CHECK_OK(sp.LoadVocabulary(absl::GetFlag(FLAGS_vocabulary),
                               absl::GetFlag(FLAGS_vocabulary_threshold)));
  }

  auto output =
      sentencepiece::filesystem::NewWritableFile(absl::GetFlag(FLAGS_output));
  CHECK_OK(output->status());

  std::string line;
  std::vector<std::string> sps;
  std::vector<int> ids;
  std::vector<std::vector<std::string>> nbest_sps;
  std::vector<std::vector<int>> nbest_ids;
  absl::flat_hash_map<std::string, int> vocab;
  sentencepiece::SentencePieceText spt;
  sentencepiece::NBestSentencePieceText nbest_spt;
  std::function<void(absl::string_view line)> process;

  const int nbest_size = absl::GetFlag(FLAGS_nbest_size);
  const float alpha = absl::GetFlag(FLAGS_alpha);

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &spt));
      for (const auto &piece : spt.pieces()) {
        if (!sp.IsUnknown(piece.id()) && !sp.IsControl(piece.id()))
          vocab[piece.piece()]++;
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "proto") {
    process = [&](absl::string_view line) { CHECK_OK(sp.Encode(line, &spt)); };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &spt));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_sps));
      for (const auto &result : nbest_sps) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_ids));
      for (const auto &result : nbest_ids) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_spt));
    };
  } else {
    LOG(FATAL) << "Unknown output format: "
               << absl::GetFlag(FLAGS_output_format);
  }

  for (const auto &filename : rest_args) {
    auto input = sentencepiece::filesystem::NewReadableFile(filename);
    CHECK_OK(input->status());
    while (input->ReadLine(&line)) {
      process(line);
    }
  }

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    for (const auto &it : sentencepiece::Sorted(vocab)) {
      output->WriteLine(it.first + "\t" +
                        sentencepiece::string_util::SimpleItoa(it.second));
    }
  }

  return 0;
}